

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::Deallocate<8ul,std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>>
               (allocator<std::unique_ptr<void_*,_std::default_delete<void_*>_>_> *alloc,void *p,
               size_t n)

{
  allocator<phmap::priv::Deallocate<8ul,std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>>(std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>*,void*,unsigned_long)::M>
  local_21;
  size_t sStack_20;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  allocator<std::unique_ptr<void_*,_std::default_delete<void_*>_>_> *alloc_local;
  
  sStack_20 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x106f,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::unique_ptr<void *>>]"
                 );
  }
  std::
  allocator<phmap::priv::Deallocate<8ul,std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>>(std::allocator<std::unique_ptr<void*,std::default_delete<void*>>>*,void*,unsigned_long)::M>
  ::allocator<std::unique_ptr<void*,std::default_delete<void*>>>(&local_21,alloc);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)&local_21,(pointer)p,sStack_20 + 7 >> 3);
  std::allocator<M>::~allocator((allocator<M> *)&local_21);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}